

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tableview.cpp
# Opt level: O0

QSize __thiscall QtMWidgets::TableViewCellLayout::minimumSize(TableViewCellLayout *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int *piVar7;
  QMargins local_90;
  QMargins local_80;
  QMargins local_70;
  QMargins local_60;
  int local_50;
  QSize local_4c;
  QSize accessorySize;
  int local_3c;
  QSize local_38;
  QSize detailedTextSize;
  QSize textSize;
  int height;
  int width;
  QSize imageSize;
  TableViewCellLayout *this_local;
  
  imageSize = (QSize)this;
  _height = (QSize)(**(code **)(*(long *)this->imageLabel + 0x78))();
  textSize.ht = QSize::width((QSize *)&height);
  textSize.wd = QSize::height((QSize *)&height);
  detailedTextSize = (QSize)(**(code **)(*(long *)this->textLabel + 0x78))();
  local_38 = (QSize)(**(code **)(*(long *)this->detailedTextLabel + 0x78))();
  local_3c = QSize::width(&detailedTextSize);
  accessorySize.ht = QSize::width(&local_38);
  piVar7 = qMax<int>(&local_3c,&accessorySize.ht);
  textSize.ht = *piVar7 + textSize.ht;
  iVar1 = QSize::height(&detailedTextSize);
  iVar2 = QSize::height(&local_38);
  accessorySize.wd = iVar1 + iVar2;
  piVar7 = qMax<int>(&textSize.wd,&accessorySize.wd);
  textSize.wd = *piVar7;
  local_4c = (QSize)(**(code **)(*(long *)this->accessoryWidget + 0x78))();
  iVar1 = QSize::width(&local_4c);
  textSize.ht = iVar1 + textSize.ht;
  local_50 = QSize::height(&local_4c);
  piVar7 = qMax<int>(&textSize.wd,&local_50);
  iVar2 = textSize.ht;
  textSize.wd = *piVar7;
  local_60 = (QMargins)QLayout::contentsMargins();
  iVar3 = QMargins::left(&local_60);
  local_70 = (QMargins)QLayout::contentsMargins();
  iVar4 = QMargins::right(&local_70);
  iVar1 = textSize.wd;
  local_80 = (QMargins)QLayout::contentsMargins();
  iVar5 = QMargins::top(&local_80);
  local_90 = (QMargins)QLayout::contentsMargins();
  iVar6 = QMargins::bottom(&local_90);
  QSize::QSize((QSize *)&this_local,iVar2 + iVar3 + iVar4,iVar1 + iVar5 + iVar6);
  return (QSize)this_local;
}

Assistant:

QSize
TableViewCellLayout::minimumSize() const
{
	const QSize imageSize = imageLabel->minimumSizeHint();

	int width = imageSize.width();
	int height = imageSize.height();

	const QSize textSize = textLabel->minimumSizeHint();
	const QSize detailedTextSize = detailedTextLabel->minimumSizeHint();

	width += qMax( textSize.width(), detailedTextSize.width() );
	height = qMax( height,
		textSize.height() + detailedTextSize.height() );

	const QSize accessorySize = accessoryWidget->minimumSizeHint();

	width += accessorySize.width();
	height = qMax( height, accessorySize.height() );

	return QSize( width + contentsMargins().left() + contentsMargins().right(),
		height + contentsMargins().top() + contentsMargins().bottom() );
}